

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::~IfcElementAssembly(IfcElementAssembly *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x82bcf0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x82bde0;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.Representation.have = 0x82bd18;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.field_0x108 = 0x82bd40;
  *(undefined8 *)&this[-1].super_IfcElement.field_0x140 = 0x82bd68;
  this[-1].PredefinedType._M_dataplus._M_p = (pointer)0x82bd90;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x82bdb8;
  puVar2 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = &this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70;
  puVar2 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x10;
  puVar3 = &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)puVar1,&PTR_construction_vtable_24__0082bdf8);
  operator_delete(puVar1,0x1a8);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}